

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

bool operator==(cmListFileContext *lhs,cmListFileContext *rhs)

{
  __type local_19;
  cmListFileContext *rhs_local;
  cmListFileContext *lhs_local;
  
  local_19 = false;
  if (lhs->Line == rhs->Line) {
    local_19 = std::operator==(&lhs->FilePath,&rhs->FilePath);
  }
  return local_19;
}

Assistant:

bool operator==(const cmListFileContext& lhs, const cmListFileContext& rhs)
{
  return lhs.Line == rhs.Line && lhs.FilePath == rhs.FilePath;
}